

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreadpoint.cpp
# Opt level: O0

ssize_t __thiscall LASreadPoint::read(LASreadPoint *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 *puVar2;
  I64 *pIVar3;
  LASreadPoint *pLVar4;
  undefined4 in_register_00000034;
  undefined1 local_44 [4];
  I32 exception;
  U32 count;
  I64 here;
  undefined4 local_28;
  uint local_24;
  U32 context;
  U32 i;
  U8 **point_local;
  LASreadPoint *this_local;
  
  _context = CONCAT44(in_register_00000034,__fd);
  local_28 = 0;
  point_local = (U8 **)this;
  if (this->dec == (ArithmeticDecoder *)0x0) {
    for (local_24 = 0; pLVar4 = (LASreadPoint *)(ulong)local_24, local_24 < this->num_readers;
        local_24 = local_24 + 1) {
      (**this->readers[local_24]->_vptr_LASreadItem)
                (this->readers[local_24],*(undefined8 *)(_context + (ulong)local_24 * 8),&local_28);
    }
  }
  else {
    if (this->chunk_count == this->chunk_size) {
      if (this->point_start != 0) {
        ArithmeticDecoder::done(this->dec);
        this->current_chunk = this->current_chunk + 1;
        if (this->current_chunk < this->tabled_chunks) {
          iVar1 = (*this->instream->_vptr_ByteStreamIn[9])();
          _exception = CONCAT44(extraout_var,iVar1);
          if (this->chunk_starts[this->current_chunk] != _exception) {
            this->current_chunk = this->current_chunk - 1;
            puVar2 = (undefined4 *)__cxa_allocate_exception(4);
            *puVar2 = 0x1267;
            __cxa_throw(puVar2,&int::typeinfo,0);
          }
        }
      }
      init_dec(this);
      if (this->current_chunk == this->tabled_chunks) {
        if (this->number_chunks <= this->current_chunk) {
          this->number_chunks = this->number_chunks + 0x100;
          pIVar3 = (I64 *)realloc_las(this->chunk_starts,(ulong)(this->number_chunks + 1) << 3);
          this->chunk_starts = pIVar3;
        }
        this->chunk_starts[this->tabled_chunks] = this->point_start;
        this->tabled_chunks = this->tabled_chunks + 1;
      }
      else if (this->chunk_totals != (U32 *)0x0) {
        this->chunk_size =
             this->chunk_totals[this->current_chunk + 1] - this->chunk_totals[this->current_chunk];
      }
      this->chunk_count = 0;
    }
    this->chunk_count = this->chunk_count + 1;
    if (this->readers == (LASreadItem **)0x0) {
      for (local_24 = 0; local_24 < this->num_readers; local_24 = local_24 + 1) {
        (**this->readers_raw[local_24]->_vptr_LASreadItem)
                  (this->readers_raw[local_24],*(undefined8 *)(_context + (ulong)local_24 * 8),
                   &local_28);
      }
      if ((this->layered_las14_compression & 1U) == 0) {
        for (local_24 = 0; local_24 < this->num_readers; local_24 = local_24 + 1) {
          (*this->readers_compressed[local_24]->_vptr_LASreadItem[4])
                    (this->readers_compressed[local_24],
                     *(undefined8 *)(_context + (ulong)local_24 * 8),&local_28);
        }
        ArithmeticDecoder::init(this->dec,(EVP_PKEY_CTX *)this->instream);
      }
      else {
        ArithmeticDecoder::init(this->dec,(EVP_PKEY_CTX *)this->instream);
        (*this->instream->_vptr_ByteStreamIn[3])(this->instream,local_44);
        for (local_24 = 0; local_24 < this->num_readers; local_24 = local_24 + 1) {
          (*this->readers_compressed[local_24]->_vptr_LASreadItem[3])();
        }
        for (local_24 = 0; local_24 < this->num_readers; local_24 = local_24 + 1) {
          (*this->readers_compressed[local_24]->_vptr_LASreadItem[4])
                    (this->readers_compressed[local_24],
                     *(undefined8 *)(_context + (ulong)local_24 * 8),&local_28);
        }
      }
      this->readers = this->readers_compressed;
      pLVar4 = this;
    }
    else {
      for (local_24 = 0; pLVar4 = (LASreadPoint *)(ulong)local_24, local_24 < this->num_readers;
          local_24 = local_24 + 1) {
        (**this->readers[local_24]->_vptr_LASreadItem)
                  (this->readers[local_24],*(undefined8 *)(_context + (ulong)local_24 * 8),&local_28
                  );
      }
    }
  }
  return CONCAT71((int7)((ulong)pLVar4 >> 8),1);
}

Assistant:

BOOL LASreadPoint::read(U8* const * point)
{
  U32 i;
  U32 context = 0;

  try
  {
    if (dec)
    {
      if (chunk_count == chunk_size)
      {
        if (point_start != 0)
        {
          dec->done();
          current_chunk++;
          // check integrity
          if (current_chunk < tabled_chunks)
          {
            I64 here = instream->tell();
            if (chunk_starts[current_chunk] != here)
            {
              // previous chunk was corrupt
              current_chunk--;
              throw 4711;
            }
          }
        }
        init_dec();
        if (current_chunk == tabled_chunks) // no or incomplete chunk table?
        {
          if (current_chunk >= number_chunks)
          {
            number_chunks += 256;
            chunk_starts = (I64*)realloc_las(chunk_starts, sizeof(I64)*(number_chunks+1));
          }
          chunk_starts[tabled_chunks] = point_start; // needs fixing
          tabled_chunks++;
        }
        else if (chunk_totals) // variable sized chunks?
        {
          chunk_size = chunk_totals[current_chunk+1]-chunk_totals[current_chunk];
        }
        chunk_count = 0;
      }
      chunk_count++;

      if (readers)
      {
        for (i = 0; i < num_readers; i++)
        {
          readers[i]->read(point[i], context);
        }
      }
      else
      {
        for (i = 0; i < num_readers; i++)
        {
          readers_raw[i]->read(point[i], context);
        }
        if (layered_las14_compression)
        {
          // for layered compression 'dec' only hands over the stream
          dec->init(instream, FALSE);
          // read how many points are in the chunk
          U32 count;
          instream->get32bitsLE((U8*)&count);
          // read the sizes of all layers
          for (i = 0; i < num_readers; i++)
          {
            ((LASreadItemCompressed*)(readers_compressed[i]))->chunk_sizes();
          }
          for (i = 0; i < num_readers; i++)
          {
            ((LASreadItemCompressed*)(readers_compressed[i]))->init(point[i], context);
          }
          if (DEBUG_OUTPUT_NUM_BYTES_DETAILS) fprintf(stderr, "\n");
        }
        else
        {
          for (i = 0; i < num_readers; i++)
          {
            ((LASreadItemCompressed*)(readers_compressed[i]))->init(point[i], context);
          }
          dec->init(instream);
        }
        readers = readers_compressed;
      }
    }
    else
    {
      for (i = 0; i < num_readers; i++)
      {
        readers[i]->read(point[i], context);
      }
    }
  }
  catch (I32 exception) 
  {
    // create error string
    if (last_error == 0) last_error = new CHAR[128];
    // report error
    if (exception == EOF)
    {
      // end-of-file
      if (dec)
      {
        snprintf(last_error, 128, "end-of-file during chunk with index %u", current_chunk);
      }
      else
      {
        snprintf(last_error, 128, "end-of-file");
      }
    }
    else
    {
      // decompression error
      snprintf(last_error, 128, "chunk with index %u of %u is corrupt", current_chunk, tabled_chunks);
      // if we know where the next chunk starts ...
      if ((current_chunk+1) < tabled_chunks)
      {
        // ... try to seek to the next chunk
        instream->seek(chunk_starts[(current_chunk+1)]);
        // ... ready for next LASreadPoint::read()
        chunk_count = chunk_size;
      }
    }
    return FALSE;
  }
  return TRUE;
}